

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     idiv<false,unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination_high,modify_t<unsigned_char> destination_low,
               read_t<unsigned_char> source,Context *context)

{
  uchar uVar1;
  uchar uVar2;
  long lVar3;
  uchar uVar4;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,source) != 0) {
    uVar1 = *destination_high;
    uVar2 = *destination_low;
    lVar3 = (long)(int)CONCAT11(uVar1,uVar2) / (long)(int)(char)source;
    uVar4 = (uchar)lVar3;
    if ((int)(char)uVar4 == (int)lVar3) {
      *destination_low = uVar4;
      *destination_high = (uchar)((int)CONCAT11(uVar1,uVar2) % (int)(char)source);
      return;
    }
  }
  interrupt<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (0,context);
  return;
}

Assistant:

void idiv(
	modify_t<IntT> destination_high,
	modify_t<IntT> destination_low,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		IF SRC = 0
			THEN #DE; (* divide error *)
		FI;
		IF OperandSize = 8 (* word/byte operation *)
			THEN
				temp ← AX / SRC; (* signed division *)
				IF (temp > 7FH) OR (temp < 80H) (* if a positive result is greater than 7FH or a negative result is less than 80H *)
					THEN #DE; (* divide error *) ;
					ELSE
						AL ← temp;
						AH ← AX MOD SRC;
				FI;
		ELSE
			IF OperandSize = 16 (* doubleword/word operation *)
				THEN
					temp ← DX:AX / SRC; (* signed division *)
					IF (temp > 7FFFH) OR (temp < 8000H) (* if a positive result is greater than 7FFFH or a negative result is less than 8000H *)
						THEN #DE; (* divide error *) ;
						ELSE
							AX ← temp;
							DX ← DX:AX MOD SRC;
					FI;
				ELSE (* quadword/doubleword operation *)
					temp ← EDX:EAX / SRC; (* signed division *)
					IF (temp > 7FFFFFFFH) OR (temp < 80000000H) (* if a positive result is greater than 7FFFFFFFH or a negative result is less than 80000000H *)
						THEN #DE; (* divide error *) ;
						ELSE
							EAX ← temp;
							EDX ← EDX:EAX MOD SRC;
						FI;
			FI;
		FI;
	*/
	/*
		The CF, OF, SF, ZF, AF, and PF flags are undefined.
	*/
	if(!source) {
		interrupt(Interrupt::DivideError, context);
		return;
	}

	// TEMPORARY HACK. Will not work with DWords.
	using sIntT = typename std::make_signed<IntT>::type;
	const int32_t dividend = (sIntT(destination_high) << (8 * sizeof(IntT))) + destination_low;
	auto result = dividend / sIntT(source);

	// An 8086 quirk: rep IDIV performs an IDIV that switches the sign on its result,
	// due to reuse of an internal flag.
	if constexpr (invert) {
		result = -result;
	}

	if(sIntT(result) != result) {
		interrupt(Interrupt::DivideError, context);
		return;
	}

	destination_low = IntT(result);
	destination_high = IntT(dividend % sIntT(source));
}